

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O2

Real __thiscall amrex::MLMG::MLRhsNormInf(MLMG *this,bool local)

{
  int alev;
  ulong uVar1;
  long lVar2;
  Real RVar3;
  double extraout_XMM0_Qa;
  double dVar4;
  
  lVar2 = 0;
  RVar3 = 0.0;
  for (uVar1 = 0; (long)uVar1 <= (long)this->finest_amr_lev; uVar1 = uVar1 + 1) {
    (*this->linop->_vptr_MLLinOp[0x33])
              (this->linop,uVar1 & 0xffffffff,
               (long)&(((this->rhs).super_vector<amrex::Any,_std::allocator<amrex::Any>_>.
                        super__Vector_base<amrex::Any,_std::allocator<amrex::Any>_>._M_impl.
                        super__Vector_impl_data._M_start)->m_ptr)._M_t.
                      super___uniq_ptr_impl<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_amrex::Any::innards_base_*,_std::default_delete<amrex::Any::innards_base>_>
                      .super__Head_base<0UL,_amrex::Any::innards_base_*,_false>._M_head_impl + lVar2
               ,1);
    dVar4 = extraout_XMM0_Qa;
    if (extraout_XMM0_Qa <= RVar3) {
      dVar4 = RVar3;
    }
    lVar2 = lVar2 + 8;
    RVar3 = dVar4;
  }
  return RVar3;
}

Assistant:

Real
MLMG::MLRhsNormInf (bool local)
{
    BL_PROFILE("MLMG::MLRhsNormInf()");
    Real r = 0.0_rt;
    for (int alev = 0; alev <= finest_amr_lev; ++alev) {
        auto t = linop.AnyNormInfMask(alev, rhs[alev], true);
        r = std::max(r, t);
    }
    if (!local) ParallelAllReduce::Max(r, ParallelContext::CommunicatorSub());
    return r;
}